

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O3

void __thiscall tcpproxy::tcpproxy(tcpproxy *this,naiveconfig *cfg1)

{
  proxy::proxy(&this->super_proxy);
  (this->super_proxy)._vptr_proxy = (_func_int **)&PTR__tcpproxy_00109d70;
  (this->sfh)._M_h._M_buckets = &(this->sfh)._M_h._M_single_bucket;
  (this->sfh)._M_h._M_bucket_count = 1;
  (this->sfh)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->sfh)._M_h._M_element_count = 0;
  (this->sfh)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->sfh)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->sfh)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->events = (epoll_event *)0x0;
  (this->super_proxy).cfg = cfg1;
  return;
}

Assistant:

tcpproxy::tcpproxy(naiveconfig *cfg1)
{
    events = NULL;
    cfg = cfg1;
}